

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O0

BBox<1> Omega_h::find_bounding_box<1>(Reals *coords)

{
  BBox<1> BVar1;
  Read<double> local_e0;
  GetBBoxOp<1> local_d0;
  undefined8 local_b8;
  Few<double,_1> FStack_b0;
  int local_a4;
  undefined4 local_a0;
  int local_9c;
  undefined8 uStack_98;
  Int i;
  BBox<1> init;
  int npts;
  Reals *coords_local;
  ulong local_10;
  
  if (((ulong)(coords->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((coords->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(coords->write_).shared_alloc_.alloc >> 3;
  }
  local_a4 = divide_no_remainder<int>((int)(local_10 >> 3),1);
  for (local_9c = 0; local_9c < 1; local_9c = local_9c + 1) {
    *(undefined8 *)((long)&stack0xffffffffffffff68 + (long)local_9c * 8) = 0x7fefffffffffffff;
    (&init.min)[local_9c].super_Few<double,_1>.array_[0] = -1.79769313486232e+308;
  }
  local_a0 = 0;
  local_b8 = uStack_98;
  FStack_b0.array_[0] = (double  [1])(double  [1])init.min.super_Few<double,_1>.array_[0];
  init.max.super_Few<double,_1>.array_[0]._4_4_ = local_a4;
  Read<double>::Read(&local_e0,coords);
  GetBBoxOp<1>::GetBBoxOp(&local_d0,&local_e0);
  BVar1 = transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<1>,Omega_h::BBox<1>,Omega_h::UniteOp<1>>
                    ((int)local_b8,FStack_b0.array_[0],local_a0,local_a4,&local_d0);
  GetBBoxOp<1>::~GetBBoxOp(&local_d0);
  Read<double>::~Read(&local_e0);
  return BVar1;
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}